

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bool-type.cpp
# Opt level: O1

Up __thiscall yactfr::FixedLengthBooleanType::_clone(FixedLengthBooleanType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_38;
  _func_int **local_30;
  BitOrder local_28;
  ByteOrder local_24;
  uint local_20;
  uint local_1c;
  MapItem *local_18;
  
  local_1c = *(uint *)(in_RSI + 0xc);
  local_20 = *(uint *)(in_RSI + 0x18);
  local_24 = *(ByteOrder *)(in_RSI + 0x1c);
  local_28 = *(BitOrder *)(in_RSI + 0x20);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    local_38._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffffe8,*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8
                  );
    local_38._M_head_impl = local_18;
    local_18 = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffffe8);
  }
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((FixedLengthBooleanType *)&local_30,&local_1c,&local_20,&local_24,&local_28,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       local_30;
  local_30 = (_func_int **)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBooleanType::_clone() const
{
    return FixedLengthBooleanType::create(this->alignment(), this->length(), this->byteOrder(),
                                          this->bitOrder(),
                                          internal::tryCloneAttrs(this->attributes()));
}